

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLinActuator::UpdateTime(ChLinkLinActuator *this,double mytime)

{
  Coordsys *pCVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ChMarker *pCVar4;
  ChMarker *pCVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 (*pauVar10) [16];
  undefined1 auVar11 [64];
  undefined1 auVar13 [64];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Vector mx;
  ChVector<double> result_2;
  ChVector<double> result;
  ChVector<double> result_1;
  Vector mz;
  ChVector<double> local_118;
  double local_100;
  undefined1 local_f8 [16];
  double dStack_e8;
  double dStack_e0;
  undefined1 local_d8 [16];
  double local_c8;
  undefined1 local_b8 [40];
  double dStack_90;
  double dStack_88;
  undefined1 local_80 [32];
  double dStack_60;
  double dStack_48;
  double local_40;
  ChVector<double> local_38;
  undefined1 auVar12 [64];
  
  ChLinkLockLock::UpdateTime(&this->super_ChLinkLockLock,mytime);
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  pCVar4->motion_type = M_MOTION_EXTERNAL;
  ChMatrix33<double>::Set_A_quaternion
            ((ChMatrix33<double> *)local_80,&(pCVar4->abs_frame).super_ChFrame<double>.coord.rot);
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker1;
  pCVar5 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  local_d8 = vsubpd_avx(*(undefined1 (*) [16])
                         (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data,
                        *(undefined1 (*) [16])
                         (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data);
  local_c8 = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[2] -
             (pCVar5->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  Vnorm<double>(&local_118,(ChVector<double> *)local_d8);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_80._8_8_;
  auVar6._8_8_ = local_118.m_data[1];
  auVar6._0_8_ = local_118.m_data[0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dStack_60;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dStack_48;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = local_118.m_data[1];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = local_118.m_data[2];
  auVar22 = vunpcklpd_avx(auVar22,auVar26);
  if ((((((double)local_80._8_8_ == local_118.m_data[0]) &&
        (!NAN((double)local_80._8_8_) && !NAN(local_118.m_data[0]))) &&
       (dStack_60 == local_118.m_data[1])) &&
      ((!NAN(dStack_60) && !NAN(local_118.m_data[1]) && (dStack_48 == local_118.m_data[2])))) &&
     (!NAN(dStack_48) && !NAN(local_118.m_data[2]))) {
    if ((local_118.m_data[0] != 1.0) || (NAN(local_118.m_data[0]))) {
      pauVar10 = (undefined1 (*) [16])&VECT_X;
    }
    else {
      pauVar10 = (undefined1 (*) [16])&VECT_Y;
    }
    auVar22 = *pauVar10;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)pauVar10[1];
  }
  auVar26 = vshufpd_avx(auVar22,auVar22,1);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar26._0_8_ * local_118.m_data[2];
  auVar20 = vfmsub213sd_fma(auVar20,auVar23,auVar27);
  local_b8._0_8_ = auVar20._0_8_;
  auVar20 = vunpcklpd_avx(auVar23,auVar22);
  auVar21._0_8_ = auVar20._0_8_ * local_118.m_data[0];
  auVar21._8_8_ = auVar20._8_8_ * local_118.m_data[1];
  auVar6 = vunpcklpd_avx(auVar18,auVar6);
  auVar22 = vfmsub213pd_fma(auVar6,auVar22,auVar21);
  local_b8._8_8_ = auVar22._0_8_;
  local_b8._16_8_ = auVar22._8_8_;
  Vnorm<double>(&local_38,(ChVector<double> *)local_b8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = local_38.m_data[0];
  auVar24._8_8_ = local_38.m_data[2];
  auVar24._0_8_ = local_38.m_data[2];
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_118.m_data[0];
  auVar28._8_8_ = local_118.m_data[2];
  auVar28._0_8_ = local_118.m_data[2];
  auVar8._8_8_ = local_38.m_data[2];
  auVar8._0_8_ = local_38.m_data[1];
  auVar7._8_8_ = local_118.m_data[2];
  auVar7._0_8_ = local_118.m_data[1];
  auVar22 = vunpcklpd_avx(auVar24,auVar19);
  auVar6 = vunpcklpd_avx(auVar28,auVar16);
  auVar25._0_8_ = local_118.m_data[1] * auVar22._0_8_;
  auVar25._8_8_ = local_118.m_data[2] * auVar22._8_8_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_118.m_data[0] * local_38.m_data[1];
  auVar22 = vfmsub231sd_fma(auVar17,auVar19,auVar7);
  local_f8 = vfmsub213pd_fma(auVar6,auVar8,auVar25);
  dStack_e8 = auVar22._0_8_;
  Vnorm<double>((ChVector<double> *)local_b8,(ChVector<double> *)local_f8);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_118.m_data[2];
  auVar11 = vbroadcastsd_avx512f(auVar2);
  auVar11 = vpermi2pd_avx512f(_DAT_00e7eac0,
                              ZEXT2464(CONCAT816(auVar11._16_8_,
                                                 CONCAT88(local_118.m_data[1],local_118.m_data[0])))
                              ,ZEXT1664(CONCAT88(local_b8._8_8_,local_b8._0_8_)));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_b8._16_8_;
  auVar12 = vbroadcastsd_avx512f(auVar3);
  auVar13._0_40_ = auVar11._0_40_;
  auVar13._40_8_ = auVar12._40_8_;
  auVar13._48_8_ = auVar11._48_8_;
  auVar13._56_8_ = auVar11._56_8_;
  local_b8._16_8_ = 0.0;
  _local_80 = vpermi2pd_avx512f(_DAT_00e7eb00,auVar13,
                                ZEXT1664(CONCAT88(local_38.m_data[1],local_38.m_data[0])));
  local_40 = local_38.m_data[2];
  register0x00001200 = ZEXT816(0) << 0x20;
  local_b8._0_8_ = 0.0;
  local_b8._8_8_ = SUB168(ZEXT816(0),4);
  local_b8._24_8_ = 1.0;
  dStack_88 = 0.0;
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  dVar14 = (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0];
  dVar15 = (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1];
  local_100 = (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2];
  if (&(pCVar4->abs_frame).super_ChFrame<double>.coord != (ChCoordsys<double> *)local_b8) {
    local_b8._0_8_ = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[0];
    local_b8._8_8_ = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[1];
    local_b8._16_8_ = (pCVar4->abs_frame).super_ChFrame<double>.coord.pos.m_data[2];
  }
  ChMatrix33<double>::Get_A_quaternion
            ((ChQuaternion<double> *)local_f8,(ChMatrix33<double> *)local_80);
  local_b8._24_8_ = local_f8._0_8_;
  dStack_90 = dStack_e8;
  local_b8._32_8_ = local_f8._8_8_;
  dStack_88 = dStack_e0;
  ChMarker::Impose_Abs_Coord
            ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
             (Coordsys *)local_b8);
  pCVar4 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2;
  (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[0] = dVar14;
  (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[1] = dVar15;
  (pCVar4->super_ChFrameMoving<double>).super_ChFrame<double>.coord.pos.m_data[2] = local_100;
  dVar14 = DAT_011dd3e0;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2880)) {
    (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = dVar14;
    (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = DAT_011dd3e8;
  }
  dVar14 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = dVar14 + this->offset;
  dVar14 = DAT_011dd3e0;
  if (this != (ChLinkLinActuator *)(sBulletDNAstr64 + 0x2848)) {
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = dVar14;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = DAT_011dd3e8;
  }
  dVar14 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[5])();
  pCVar1 = &(this->super_ChLinkLockLock).deltaC_dtdt;
  (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = dVar14;
  dVar14 = DAT_011dd3e0;
  if (pCVar1 != (Coordsys *)&VNULL) {
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = VNULL;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] = dVar14;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] = DAT_011dd3e8;
  }
  dVar14 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.
           super_ChLinkBase.super_ChPhysicsItem.super_ChObj.ChTime;
  (*((this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[6])();
  (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] = dVar14;
  dStack_e8 = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.m_data
              [2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.relM_dt.pos.
                 m_data[1];
  local_f8 = auVar9 << 0x40;
  dVar14 = ChVector<double>::Length((ChVector<double> *)local_d8);
  if (1e-06 < dVar14) {
    dVar14 = ChVector<double>::Length((ChVector<double> *)local_f8);
    dVar15 = ChVector<double>::Length((ChVector<double> *)local_d8);
    (pCVar1->pos).m_data[0] = (pCVar1->pos).m_data[0] - (dVar14 * dVar14) / dVar15;
  }
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC.rot,(ChQuaternion<double> *)&QUNIT);
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC_dt.rot,(ChQuaternion<double> *)QNULL);
  ChQuaternion<double>::operator=
            (&(this->super_ChLinkLockLock).deltaC_dtdt.rot,(ChQuaternion<double> *)QNULL);
  return;
}

Assistant:

void ChLinkLinActuator::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLockLock::UpdateTime(mytime);

    // Move (well, rotate...) marker 2 to align it in actuator direction

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    ChMatrix33<> ma(marker2->GetAbsCoord().rot);

    Vector absdist = Vsub(marker1->GetAbsCoord().pos, marker2->GetAbsCoord().pos);

    Vector mx = Vnorm(absdist);

    Vector my = ma.Get_A_Yaxis();
    if (Vequal(mx, my)) {
        if (mx.x() == 1.0)
            my = VECT_Y;
        else
            my = VECT_X;
    }
    Vector mz = Vnorm(Vcross(mx, my));
    my = Vnorm(Vcross(mz, mx));

    ma.Set_A_axis(mx, my, mz);

    Coordsys newmarkpos;
    ChVector<> oldpos = marker2->GetPos();  // backup to avoid numerical err.accumulation
    newmarkpos.pos = marker2->GetAbsCoord().pos;
    newmarkpos.rot = ma.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // rotate "main" marker2 into tangent position (may add err.accumulation)
    marker2->SetPos(oldpos);                // backup to avoid numerical err.accumulation

    // imposed relative positions/speeds
    deltaC.pos = VNULL;
    deltaC.pos.x() = dist_funct->Get_y(ChTime) + offset;  // distance is always on M2 'X' axis

    deltaC_dt.pos = VNULL;
    deltaC_dt.pos.x() = dist_funct->Get_y_dx(ChTime);  // distance speed

    deltaC_dtdt.pos = VNULL;
    deltaC_dtdt.pos.x() = dist_funct->Get_y_dxdx(ChTime);  // distance acceleration

    // add also the centripetal acceleration if distance vector's rotating,
    // as centripetal acc. of point sliding on a sphere surface.
    Vector tang_speed = GetRelM_dt().pos;
    tang_speed.x() = 0;                     // only z-y coords in relative tang speed vector
    double len_absdist = Vlength(absdist);  // don't divide by zero
    if (len_absdist > 1E-6)
        deltaC_dtdt.pos.x() -= pow(Vlength(tang_speed), 2) / Vlength(absdist);  // An = Adelta -(Vt^2 / r)

    deltaC.rot = QUNIT;  // no relative rotations imposed!
    deltaC_dt.rot = QNULL;
    deltaC_dtdt.rot = QNULL;
}